

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O0

void __thiscall HDualRow::update_dual(HDualRow *this,double theta)

{
  double dVar1;
  double *pdVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RDI;
  HTimer *in_XMM0_Qa;
  int i;
  double *workDual;
  int in_stack_ffffffffffffffbc;
  HTimer *in_stack_ffffffffffffffc0;
  int local_1c;
  
  HTimer::recordStart(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  pdVar2 = HModel::getWorkDual((HModel *)0x155f57);
  for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x60); local_1c = local_1c + 1) {
    in_stack_ffffffffffffffc0 = in_XMM0_Qa;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x80),(long)local_1c);
    dVar1 = *pvVar3;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x68),(long)local_1c);
    pdVar2[*pvVar4] = -(double)in_stack_ffffffffffffffc0 * dVar1 + pdVar2[*pvVar4];
  }
  HTimer::recordFinish(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  return;
}

Assistant:

void HDualRow::update_dual(double theta) {
    workModel->timer.recordStart(HTICK_UPDATE_DUAL);
    double *workDual = workModel->getWorkDual();
    for (int i = 0; i < packCount; i++)
        workDual[packIndex[i]] -= theta * packValue[i];
    workModel->timer.recordFinish(HTICK_UPDATE_DUAL);
}